

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeerGateway.hpp
# Opt level: O1

IpV4Gateway<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
 __thiscall
ableton::discovery::
makeIpV4Gateway<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,std::reference_wrapper<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionPeerCounter>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionTimelineCallback>::GatewayObserver,ableton::link::PeerState,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&>
          (discovery *this,
          Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
          *io,address_v4 *addr,
          Injected<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver>
          *observer,PeerState *state)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  IpV4Gateway<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  IVar3;
  UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  messenger;
  IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>
  iface;
  UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  local_170;
  UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  local_160;
  UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  local_150;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> *local_140;
  undefined8 local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_130;
  undefined8 local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  reference_wrapper<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  local_118;
  reference_wrapper<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  local_110;
  UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  local_108;
  Injected<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>_>
  local_f8;
  IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>
  local_d0;
  GatewayObserver local_a8;
  PeerState local_78;
  
  local_108.mpImpl.
  super___shared_ptr<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(io->ref)._M_data;
  IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>
  ::IpV4Interface(&local_d0,
                  (Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
                   *)&local_108,addr);
  local_f8.val.mSendSocket.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_d0.mSendSocket.mpImpl.
       super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_f8.val.mSendSocket.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_d0.mSendSocket.mpImpl.
           super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_f8.val.mMulticastReceiveSocket.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_d0.mMulticastReceiveSocket.mpImpl.
       super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_f8.val.mMulticastReceiveSocket.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_d0.mMulticastReceiveSocket.mpImpl.
           super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_140 = (Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> *)
              local_d0.mIo.ref._M_data;
  local_d0.mMulticastReceiveSocket.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_d0.mMulticastReceiveSocket.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d0.mSendSocket.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_d0.mSendSocket.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_138 = 0;
  p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_128 = 0;
  p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8.val.mIo.ref._M_data = local_d0.mIo.ref._M_data;
  local_78.nodeState.nodeId.super_NodeIdArray._M_elems =
       *(NodeIdArray *)(state->nodeState).nodeId.super_NodeIdArray._M_elems;
  local_78.nodeState.sessionId.super_NodeIdArray._M_elems =
       *(NodeIdArray *)(state->nodeState).sessionId.super_NodeIdArray._M_elems;
  local_78.nodeState.timeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (tuple<double>)
       (state->nodeState).timeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  local_78.nodeState.timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl =
       (tuple<long>)
       (state->nodeState).timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl;
  local_78.nodeState.timeline.timeOrigin.__r = (state->nodeState).timeline.timeOrigin.__r;
  local_78.endpoint.impl_.data_._0_8_ = *(undefined8 *)&(state->endpoint).impl_.data_;
  uVar1 = *(undefined8 *)((long)&(state->endpoint).impl_.data_ + 8);
  local_78.endpoint.impl_.data_._20_8_ =
       *(undefined8 *)((long)&(state->endpoint).impl_.data_ + 0x14);
  local_78.endpoint.impl_.data_._16_4_ =
       (undefined4)((ulong)*(undefined8 *)((long)&(state->endpoint).impl_.data_ + 0xc) >> 0x20);
  local_78.endpoint.impl_.data_._8_4_ = (undefined4)uVar1;
  local_78.endpoint.impl_.data_._12_4_ = (undefined4)((ulong)uVar1 >> 0x20);
  local_110._M_data = (io->ref)._M_data;
  makeUdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,512ul>,ableton::link::PeerState,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&>
            ((discovery *)&local_170,&local_f8,&local_78,
             (Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
              *)&local_110,'\x05','\x14');
  if (local_f8.val.mSendSocket.mpImpl.
      super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.val.mSendSocket.mpImpl.
               super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_f8.val.mMulticastReceiveSocket.mpImpl.
      super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.val.mMulticastReceiveSocket.mpImpl.
               super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
  }
  if (p_Stack_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_130);
  }
  local_150.mpImpl.
  super___shared_ptr<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_170.mpImpl.
       super___shared_ptr<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_150.mpImpl.
  super___shared_ptr<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_170.mpImpl.
            super___shared_ptr<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_160.mpImpl.
  super___shared_ptr<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_170.mpImpl.
  super___shared_ptr<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_170.mpImpl.
  super___shared_ptr<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_160.mpImpl.
  super___shared_ptr<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108.mpImpl.
  super___shared_ptr<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_108.mpImpl.
  super___shared_ptr<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  ::~UdpMessenger(&local_108);
  local_a8.mpImpl.
  super___shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (observer->val).mpImpl.
            super___shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_a8.mpImpl.
  super___shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (observer->val).mpImpl.
       super___shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  (observer->val).mpImpl.
  super___shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (observer->val).mpImpl.
  super___shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_a8.mAddr.type_ = (observer->val).mAddr.type_;
  local_a8.mAddr.ipv4_address_.addr_.s_addr =
       (in4_addr_type)(observer->val).mAddr.ipv4_address_.addr_.s_addr;
  local_a8.mAddr.ipv6_address_.addr_.__in6_u._0_8_ =
       *(undefined8 *)&(observer->val).mAddr.ipv6_address_.addr_.__in6_u;
  local_a8.mAddr.ipv6_address_.addr_.__in6_u._8_8_ =
       *(undefined8 *)((long)&(observer->val).mAddr.ipv6_address_.addr_.__in6_u + 8);
  local_a8.mAddr.ipv6_address_.scope_id_ = (observer->val).mAddr.ipv6_address_.scope_id_;
  local_118._M_data = (io->ref)._M_data;
  PeerGateway<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  ::PeerGateway((PeerGateway<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
                 *)this,(Injected<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>_>
                         *)&local_150,
                (Injected<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver>
                 *)&local_a8,
                (Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
                 *)&local_118);
  link::
  Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
  ::GatewayObserver::~GatewayObserver(&local_a8);
  UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  ::~UdpMessenger(&local_150);
  UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  ::~UdpMessenger(&local_160);
  UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  ::~UdpMessenger(&local_170);
  _Var2._M_pi = extraout_RDX;
  if (local_d0.mSendSocket.mpImpl.
      super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.mSendSocket.mpImpl.
               super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_d0.mMulticastReceiveSocket.mpImpl.
      super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.mMulticastReceiveSocket.mpImpl.
               super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  IVar3.mpImpl.
  super___shared_ptr<ableton::discovery::PeerGateway<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  IVar3.mpImpl.
  super___shared_ptr<ableton::discovery::PeerGateway<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (IpV4Gateway<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
          )IVar3.mpImpl.
           super___shared_ptr<ableton::discovery::PeerGateway<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

IpV4Gateway<PeerObserver, NodeState, IoContext> makeIpV4Gateway(
  util::Injected<IoContext> io,
  const asio::ip::address_v4& addr,
  util::Injected<PeerObserver> observer,
  NodeState state)
{
  using namespace std;
  using namespace util;

  const uint8_t ttl = 5;
  const uint8_t ttlRatio = 20;

  auto iface = makeIpV4Interface<v1::kMaxMessageSize>(injectRef(*io), addr);

  auto messenger =
    makeUdpMessenger(injectVal(move(iface)), move(state), injectRef(*io), ttl, ttlRatio);
  return {injectVal(move(messenger)), move(observer), move(io)};
}